

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool roaring_bitmap_contains_bulk(roaring_bitmap_t *r,roaring_bulk_context_t *context,uint32_t val)

{
  _Bool _Var1;
  short sVar2;
  uint16_t uVar3;
  int32_t iVar4;
  int32_t iVar5;
  container_t *pcVar6;
  undefined4 in_EDX;
  long *in_RSI;
  roaring_array_t *in_RDI;
  uint8_t typecode;
  int idx;
  int32_t start_idx;
  uint16_t key;
  int32_t in_stack_ffffffffffffffc8;
  undefined2 in_stack_ffffffffffffffcc;
  uint16_t in_stack_ffffffffffffffce;
  undefined4 in_stack_ffffffffffffffd0;
  int32_t iVar7;
  undefined4 in_stack_ffffffffffffffd4;
  uint8_t uVar8;
  
  sVar2 = (short)((uint)in_EDX >> 0x10);
  if ((*in_RSI == 0) || (*(short *)((long)in_RSI + 0xc) != sVar2)) {
    iVar4 = ra_advance_until((roaring_array_t *)
                             CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                             in_stack_ffffffffffffffce,in_stack_ffffffffffffffc8);
    uVar8 = (uint8_t)((uint)in_stack_ffffffffffffffd4 >> 0x18);
    iVar7 = iVar4;
    iVar5 = ra_get_size(in_RDI);
    if (iVar7 == iVar5) {
      return false;
    }
    pcVar6 = ra_get_container_at_index(in_RDI,(uint16_t)iVar4,&stack0xffffffffffffffd7);
    *in_RSI = (long)pcVar6;
    *(uint8_t *)((long)in_RSI + 0xe) = uVar8;
    *(int32_t *)(in_RSI + 1) = iVar4;
    uVar3 = ra_get_key_at_index(in_RDI,(uint16_t)iVar4);
    *(uint16_t *)((long)in_RSI + 0xc) = uVar3;
    if (*(short *)((long)in_RSI + 0xc) != sVar2) {
      return false;
    }
  }
  _Var1 = container_contains((container_t *)
                             CONCAT26(in_stack_ffffffffffffffce,
                                      CONCAT24(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8))
                             ,0,'\0');
  return _Var1;
}

Assistant:

bool roaring_bitmap_contains_bulk(const roaring_bitmap_t *r,
                                  roaring_bulk_context_t *context,
                                  uint32_t val) {
    uint16_t key = val >> 16;
    if (context->container == NULL || context->key != key) {
        int32_t start_idx = -1;
        if (context->container != NULL && context->key < key) {
            start_idx = context->idx;
        }
        int idx = ra_advance_until(&r->high_low_container, key, start_idx);
        if (idx == ra_get_size(&r->high_low_container)) {
            return false;
        }
        uint8_t typecode;
        context->container = ra_get_container_at_index(
            &r->high_low_container, (uint16_t)idx, &typecode);
        context->typecode = typecode;
        context->idx = idx;
        context->key =
            ra_get_key_at_index(&r->high_low_container, (uint16_t)idx);
        // ra_advance_until finds the next key >= the target, we found a later
        // container.
        if (context->key != key) {
            return false;
        }
    }
    // context is now set up
    return container_contains(context->container, val & 0xFFFF,
                              context->typecode);
}